

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_zip.cpp
# Opt level: O2

void duckdb::ListZipFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  LogicalTypeId LVar1;
  pointer pVVar2;
  idx_t count;
  pointer pVVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  data_ptr_t pdVar6;
  bool bVar7;
  Vector *pVVar8;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference pvVar9;
  reference pvVar10;
  idx_t iVar11;
  pointer pSVar12;
  reference pvVar13;
  TemplatedValidityMask<unsigned_long> *pTVar14;
  reference pvVar15;
  reference pvVar16;
  pointer pVVar17;
  type vector;
  reference new_validity;
  ulong uVar18;
  idx_t iVar19;
  ulong uVar20;
  data_t dVar21;
  ulong uVar22;
  size_type __n;
  idx_t i;
  size_type __n_00;
  size_type sVar23;
  size_type row_idx;
  size_type sVar24;
  idx_t local_110;
  idx_t local_f8;
  vector<duckdb::SelectionVector,_true> selections;
  vector<duckdb::UnifiedVectorFormat,_true> input_lists;
  sel_t *local_88;
  element_type *peStack_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  idx_t local_70;
  vector<duckdb::ValidityMask,_true> masks;
  vector<unsigned_long,_true> lengths;
  
  pVVar2 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  count = args->count;
  pVVar3 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = result->data;
  pVVar8 = ListVector::GetEntry(result);
  this = StructVector::GetEntries(pVVar8);
  pvVar9 = vector<duckdb::Vector,_true>::back(&args->data);
  LVar1 = (pvVar9->type).id_;
  input_lists.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  input_lists.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  input_lists.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::resize
            (&input_lists.
              super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
             ,((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x68);
  sVar24 = ((long)pVVar2 - (long)pVVar3) / 0x68 - (ulong)(LVar1 == BOOLEAN);
  for (uVar18 = 0;
      uVar18 < (ulong)(((long)(args->data).
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(args->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar18 = uVar18 + 1)
  {
    pvVar9 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar18);
    pvVar10 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&input_lists,uVar18);
    Vector::ToUnifiedFormat(pvVar9,count,pvVar10);
  }
  lengths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lengths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  lengths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar19 = 0;
  local_110 = 0;
  do {
    if (iVar19 == count) {
      ListVector::SetListSize(result,local_110);
      ListVector::Reserve(result,local_110);
      selections.super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
      super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      selections.super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
      super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      selections.super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
      super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      masks.super_vector<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>.
      super__Vector_base<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      masks.super_vector<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>.
      super__Vector_base<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      masks.super_vector<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>.
      super__Vector_base<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar23 = sVar24;
      while (bVar7 = sVar23 != 0, sVar23 = sVar23 - 1, bVar7) {
        SelectionVector::SelectionVector((SelectionVector *)&local_88,local_110);
        ::std::vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>::
        emplace_back<duckdb::SelectionVector>
                  (&selections.
                    super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>,
                   (SelectionVector *)&local_88);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
        local_88 = (sel_t *)0x0;
        peStack_80 = (element_type *)0x0;
        local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_70 = local_110;
        ::std::vector<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>::
        emplace_back<duckdb::ValidityMask>
                  (&masks.super_vector<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>,
                   (ValidityMask *)&local_88);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
      }
      local_f8 = 0;
      for (__n = 0; __n != count; __n = __n + 1) {
        pvVar13 = vector<unsigned_long,_true>::get<true>(&lengths,__n);
        uVar18 = *pvVar13;
        for (__n_00 = 0; __n_00 != sVar24; __n_00 = __n_00 + 1) {
          pvVar10 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&input_lists,__n_00);
          psVar5 = pvVar10->sel->sel_vector;
          row_idx = __n;
          if (psVar5 != (sel_t *)0x0) {
            row_idx = (size_type)psVar5[__n];
          }
          bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&(pvVar10->validity).super_TemplatedValidityMask<unsigned_long>,row_idx
                            );
          if (bVar7) {
            iVar19 = *(idx_t *)(pvVar10->data + row_idx * 0x10);
            uVar20 = *(ulong *)(pvVar10->data + row_idx * 0x10 + 8);
            uVar22 = uVar20;
            iVar11 = local_f8;
            if (uVar18 < uVar20) {
              uVar22 = uVar18;
            }
            while (uVar22 != 0) {
              pvVar9 = vector<duckdb::Vector,_true>::get<true>(&args->data,__n_00);
              pVVar8 = ListVector::GetEntry(pvVar9);
              FlatVector::VerifyFlatVector(pVVar8);
              bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                (&(pVVar8->validity).super_TemplatedValidityMask<unsigned_long>,
                                 iVar19);
              if (!bVar7) {
                pTVar14 = &vector<duckdb::ValidityMask,_true>::get<true>(&masks,__n_00)->
                           super_TemplatedValidityMask<unsigned_long>;
                TemplatedValidityMask<unsigned_long>::SetInvalid(pTVar14,iVar11);
              }
              pvVar15 = vector<duckdb::SelectionVector,_true>::get<true>(&selections,__n_00);
              pvVar15->sel_vector[iVar11] = (sel_t)iVar19;
              iVar19 = iVar19 + 1;
              uVar22 = uVar22 - 1;
              iVar11 = iVar11 + 1;
            }
          }
          else {
            uVar20 = 0;
          }
          if (uVar20 < uVar18) {
            iVar19 = local_f8 + uVar20;
            for (; uVar20 < uVar18; uVar20 = uVar20 + 1) {
              pTVar14 = &vector<duckdb::ValidityMask,_true>::get<true>(&masks,__n_00)->
                         super_TemplatedValidityMask<unsigned_long>;
              TemplatedValidityMask<unsigned_long>::SetInvalid(pTVar14,iVar19);
              pvVar15 = vector<duckdb::SelectionVector,_true>::get<true>(&selections,__n_00);
              pvVar15->sel_vector[iVar19] = 0;
              iVar19 = iVar19 + 1;
            }
          }
        }
        *(ulong *)(pdVar4 + __n * 0x10 + 8) = uVar18;
        *(idx_t *)(pdVar4 + __n * 0x10) = local_f8;
        local_f8 = local_f8 + uVar18;
      }
      for (sVar23 = 0; sVar24 != sVar23; sVar23 = sVar23 + 1) {
        pvVar9 = vector<duckdb::Vector,_true>::get<true>(&args->data,sVar23);
        LogicalType::LogicalType((LogicalType *)&local_88,SQLNULL);
        bVar7 = LogicalType::operator!=(&pvVar9->type,(LogicalType *)&local_88);
        LogicalType::~LogicalType((LogicalType *)&local_88);
        if (bVar7) {
          pvVar16 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::get<true>(this,sVar23);
          pVVar17 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                    operator->(pvVar16);
          pvVar9 = vector<duckdb::Vector,_true>::get<true>(&args->data,sVar23);
          pVVar8 = ListVector::GetEntry(pvVar9);
          pvVar15 = vector<duckdb::SelectionVector,_true>::get<true>(&selections,sVar23);
          Vector::Slice(pVVar17,pVVar8,pvVar15,local_110);
        }
        pvVar16 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this,sVar23);
        pVVar17 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (pvVar16);
        Vector::Flatten(pVVar17,local_110);
        pvVar16 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this,sVar23);
        vector = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (pvVar16);
        new_validity = vector<duckdb::ValidityMask,_true>::get<true>(&masks,sVar23);
        FlatVector::SetValidity(vector,new_validity);
      }
      bVar7 = DataChunk::AllConstant(args);
      Vector::SetVectorType(result,bVar7 * '\x02');
      ::std::vector<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>::~vector
                (&masks.super_vector<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>);
      ::std::vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>::~vector
                (&selections.
                  super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>);
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&lengths);
      ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::
      ~vector(&input_lists.
               super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
             );
      return;
    }
    if (LVar1 == BOOLEAN) {
      pvVar10 = vector<duckdb::UnifiedVectorFormat,_true>::back(&input_lists);
      psVar5 = pvVar10->sel->sel_vector;
      iVar11 = iVar19;
      if (psVar5 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar5[iVar19];
      }
      bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(pvVar10->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
      if (!bVar7) goto LAB_017aba1f;
      dVar21 = pvVar10->data[iVar11];
      selections.super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
      super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      if (dVar21 != '\0') {
        selections.super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
        super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x7fffffff;
      }
    }
    else {
LAB_017aba1f:
      dVar21 = '\0';
      selections.super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
      super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
    for (sVar23 = 0; sVar24 != sVar23; sVar23 = sVar23 + 1) {
      pvVar9 = vector<duckdb::Vector,_true>::get<true>(&args->data,sVar23);
      LogicalType::LogicalType((LogicalType *)&local_88,SQLNULL);
      bVar7 = LogicalType::operator==(&pvVar9->type,(LogicalType *)&local_88);
      if (bVar7) {
        LogicalType::~LogicalType((LogicalType *)&local_88);
LAB_017abaf1:
        pSVar12 = (pointer)0x0;
      }
      else {
        pvVar9 = vector<duckdb::Vector,_true>::get<true>(&args->data,sVar23);
        iVar11 = ListVector::GetListSize(pvVar9);
        LogicalType::~LogicalType((LogicalType *)&local_88);
        if (iVar11 == 0) goto LAB_017abaf1;
        pvVar10 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&input_lists,sVar23);
        psVar5 = pvVar10->sel->sel_vector;
        iVar11 = iVar19;
        if (psVar5 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar5[iVar19];
        }
        pvVar10 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&input_lists,sVar23);
        pdVar6 = pvVar10->data;
        pvVar10 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&input_lists,sVar23);
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(pvVar10->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar7) goto LAB_017abaf1;
        pSVar12 = *(pointer *)(pdVar6 + iVar11 * 0x10 + 8);
      }
      if (dVar21 == '\0') {
        if (pSVar12 < selections.
                      super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>
                      .
                      super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          pSVar12 = selections.
                    super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
                    super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      else if (selections.
               super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
               super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>
               ._M_impl.super__Vector_impl_data._M_start < pSVar12) {
        pSVar12 = selections.
                  super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
                  super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      selections.super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
      super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>._M_impl.
      super__Vector_impl_data._M_start = pSVar12;
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&lengths,
               (value_type_conflict1 *)&selections);
    local_110 = (long)&(selections.
                        super_vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>
                        .
                        super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>
                        ._M_impl.super__Vector_impl_data._M_start)->sel_vector + local_110;
    iVar19 = iVar19 + 1;
  } while( true );
}

Assistant:

static void ListZipFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	idx_t count = args.size();
	idx_t args_size = args.ColumnCount();
	auto *result_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_struct = ListVector::GetEntry(result);
	auto &struct_entries = StructVector::GetEntries(result_struct);
	bool truncate_flags_set = false;

	// Check flag
	if (args.data.back().GetType().id() == LogicalTypeId::BOOLEAN) {
		truncate_flags_set = true;
		args_size--;
	}

	vector<UnifiedVectorFormat> input_lists;
	input_lists.resize(args.ColumnCount());
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		args.data[i].ToUnifiedFormat(count, input_lists[i]);
	}

	// Handling output row for each input row
	idx_t result_size = 0;
	vector<idx_t> lengths;
	for (idx_t j = 0; j < count; j++) {
		// Is flag for current row set
		bool truncate_to_shortest = false;
		if (truncate_flags_set) {
			auto &flag_vec = input_lists.back();
			idx_t flag_idx = flag_vec.sel->get_index(j);
			if (flag_vec.validity.RowIsValid(flag_idx)) {
				truncate_to_shortest = UnifiedVectorFormat::GetData<bool>(flag_vec)[flag_idx];
			}
		}

		// Calculation of the outgoing list size
		idx_t len = truncate_to_shortest ? NumericLimits<int>::Maximum() : 0;
		for (idx_t i = 0; i < args_size; i++) {
			idx_t curr_size;
			if (args.data[i].GetType() == LogicalType::SQLNULL || ListVector::GetListSize(args.data[i]) == 0) {
				curr_size = 0;
			} else {
				idx_t sel_idx = input_lists[i].sel->get_index(j);
				auto curr_data = UnifiedVectorFormat::GetData<list_entry_t>(input_lists[i]);
				curr_size = input_lists[i].validity.RowIsValid(sel_idx) ? curr_data[sel_idx].length : 0;
			}

			// Dependent on flag using gt or lt
			if (truncate_to_shortest) {
				len = len > curr_size ? curr_size : len;
			} else {
				len = len < curr_size ? curr_size : len;
			}
		}
		lengths.push_back(len);
		result_size += len;
	}

	ListVector::SetListSize(result, result_size);
	ListVector::Reserve(result, result_size);
	vector<SelectionVector> selections;
	vector<ValidityMask> masks;
	for (idx_t i = 0; i < args_size; i++) {
		selections.push_back(SelectionVector(result_size));
		masks.push_back(ValidityMask(result_size));
	}

	idx_t offset = 0;
	for (idx_t j = 0; j < count; j++) {
		idx_t len = lengths[j];
		for (idx_t i = 0; i < args_size; i++) {
			auto &curr = input_lists[i];
			idx_t sel_idx = curr.sel->get_index(j);
			idx_t curr_off = 0;
			idx_t curr_len = 0;

			// Copying values from the given lists
			if (curr.validity.RowIsValid(sel_idx)) {
				auto input_lists_data = UnifiedVectorFormat::GetData<list_entry_t>(curr);
				curr_off = input_lists_data[sel_idx].offset;
				curr_len = input_lists_data[sel_idx].length;
				auto copy_len = len < curr_len ? len : curr_len;
				idx_t entry = offset;
				for (idx_t k = 0; k < copy_len; k++) {
					if (!FlatVector::Validity(ListVector::GetEntry(args.data[i])).RowIsValid(curr_off + k)) {
						masks[i].SetInvalid(entry + k);
					}
					selections[i].set_index(entry + k, curr_off + k);
				}
			}

			// Set NULL values for list that are shorter than the output list
			if (len > curr_len) {
				for (idx_t d = curr_len; d < len; d++) {
					masks[i].SetInvalid(d + offset);
					selections[i].set_index(d + offset, 0);
				}
			}
		}
		result_data[j].length = len;
		result_data[j].offset = offset;
		offset += len;
	}
	for (idx_t child_idx = 0; child_idx < args_size; child_idx++) {
		if (args.data[child_idx].GetType() != LogicalType::SQLNULL) {
			struct_entries[child_idx]->Slice(ListVector::GetEntry(args.data[child_idx]), selections[child_idx],
			                                 result_size);
		}
		struct_entries[child_idx]->Flatten(result_size);
		FlatVector::SetValidity((*struct_entries[child_idx]), masks[child_idx]);
	}
	result.SetVectorType(args.AllConstant() ? VectorType::CONSTANT_VECTOR : VectorType::FLAT_VECTOR);
}